

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spooky.h
# Opt level: O0

void SpookyHash::EndPartial
               (uint64 *h0,uint64 *h1,uint64 *h2,uint64 *h3,uint64 *h4,uint64 *h5,uint64 *h6,
               uint64 *h7,uint64 *h8,uint64 *h9,uint64 *h10,uint64 *h11)

{
  uint64 uVar1;
  ulong *in_RCX;
  ulong *in_RDX;
  uint64 *in_RSI;
  ulong *in_RDI;
  ulong *in_R8;
  ulong *in_R9;
  
  *h0 = *in_RSI + *h0;
  *in_RDX = *h0 ^ *in_RDX;
  uVar1 = Rot64(*in_RSI,0x2c);
  *in_RSI = uVar1;
  *in_RDI = *in_RDX + *in_RDI;
  *in_RCX = *in_RDI ^ *in_RCX;
  uVar1 = Rot64(*in_RDX,0xf);
  *in_RDX = uVar1;
  *in_RSI = *in_RCX + *in_RSI;
  *in_R8 = *in_RSI ^ *in_R8;
  uVar1 = Rot64(*in_RCX,0x22);
  *in_RCX = uVar1;
  *in_RDX = *in_R8 + *in_RDX;
  *in_R9 = *in_RDX ^ *in_R9;
  uVar1 = Rot64(*in_R8,0x15);
  *in_R8 = uVar1;
  *in_RCX = *in_R9 + *in_RCX;
  *h5 = *in_RCX ^ *h5;
  uVar1 = Rot64(*in_R9,0x26);
  *in_R9 = uVar1;
  *in_R8 = *h5 + *in_R8;
  *h4 = *in_R8 ^ *h4;
  uVar1 = Rot64(*h5,0x21);
  *h5 = uVar1;
  *in_R9 = *h4 + *in_R9;
  *h3 = *in_R9 ^ *h3;
  uVar1 = Rot64(*h4,10);
  *h4 = uVar1;
  *h5 = *h3 + *h5;
  *h2 = *h5 ^ *h2;
  uVar1 = Rot64(*h3,0xd);
  *h3 = uVar1;
  *h4 = *h2 + *h4;
  *h1 = *h4 ^ *h1;
  uVar1 = Rot64(*h2,0x26);
  *h2 = uVar1;
  *h3 = *h1 + *h3;
  *h0 = *h3 ^ *h0;
  uVar1 = Rot64(*h1,0x35);
  *h1 = uVar1;
  *h2 = *h0 + *h2;
  *in_RDI = *h2 ^ *in_RDI;
  uVar1 = Rot64(*h0,0x2a);
  *h0 = uVar1;
  *h1 = *in_RDI + *h1;
  *in_RSI = *h1 ^ *in_RSI;
  uVar1 = Rot64(*in_RDI,0x36);
  *in_RDI = uVar1;
  return;
}

Assistant:

static INLINE void EndPartial(
        uint64 &h0, uint64 &h1, uint64 &h2, uint64 &h3,
        uint64 &h4, uint64 &h5, uint64 &h6, uint64 &h7, 
        uint64 &h8, uint64 &h9, uint64 &h10,uint64 &h11)
    {
        h11+= h1;    h2 ^= h11;   h1 = Rot64(h1,44);
	h0 += h2;    h3 ^= h0;    h2 = Rot64(h2,15);
	h1 += h3;    h4 ^= h1;    h3 = Rot64(h3,34);
	h2 += h4;    h5 ^= h2;    h4 = Rot64(h4,21);
	h3 += h5;    h6 ^= h3;    h5 = Rot64(h5,38);
	h4 += h6;    h7 ^= h4;    h6 = Rot64(h6,33);
	h5 += h7;    h8 ^= h5;    h7 = Rot64(h7,10);
	h6 += h8;    h9 ^= h6;    h8 = Rot64(h8,13);
	h7 += h9;    h10^= h7;    h9 = Rot64(h9,38);
	h8 += h10;   h11^= h8;    h10= Rot64(h10,53);
	h9 += h11;   h0 ^= h9;    h11= Rot64(h11,42);
	h10+= h0;    h1 ^= h10;   h0 = Rot64(h0,54);
    }